

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.h
# Opt level: O1

optional<NetAction> s_try_recv<NetAction>(socket_t *socket)

{
  ulong uVar1;
  ulong uVar2;
  NetAction val;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  response;
  uint local_44;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_40;
  bool local_20;
  
  s_recv_raw_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40,socket);
  if (local_20 == true) {
    local_44 = 0;
    memcpy(&local_44,(void *)local_40._M_value._M_dataplus._M_p,local_40._M_value._M_string_length);
    uVar1 = (ulong)local_44;
    uVar2 = 0x100000000;
  }
  else {
    uVar2 = 0;
    uVar1 = 0;
  }
  if (local_20 != false) {
    local_20 = false;
    if (local_40._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_40._M_value + 0x10)) {
      operator_delete((void *)local_40._M_value._M_dataplus._M_p,local_40._16_8_ + 1);
    }
  }
  return (_Optional_base<NetAction,_true,_true>)
         (_Optional_base<NetAction,_true,_true>)(uVar1 | uVar2);
}

Assistant:

std::optional<T> s_try_recv(zmq::socket_t *socket) {
    static_assert(is_transferable<T>::value, "Cannot transfer this type");
    auto response{s_recv_raw(socket)};
    if (!response.has_value()) {
        return std::nullopt;
    }

    T val{};
    assert(sizeof(T) == response->size());
    ::memcpy(&val, response->data(), response->size());
    return val;
}